

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

Str tl::toUtf8(CStr32 o)

{
  uint uVar1;
  uint3 uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long in_RDX;
  ulong extraout_RDX;
  ulong uVar6;
  uint uVar7;
  u32 size;
  byte bVar8;
  StrT<char> *this;
  Str SVar9;
  
  this = o._0_8_;
  uVar7 = (uint)o._str;
  if (uVar7 == 0) {
    size = 0;
  }
  else {
    lVar4 = 0;
    size = 0;
    do {
      uVar3 = *(uint *)(in_RDX + lVar4);
      iVar5 = 1;
      if ((0x7f < uVar3) && (iVar5 = 2, 0x7ff < uVar3)) {
        iVar5 = 4 - (uint)(uVar3 < 0x10000);
      }
      size = size + iVar5;
      lVar4 = lVar4 + 4;
    } while ((ulong)uVar7 * 4 - lVar4 != 0);
  }
  StrT<char>::StrT(this,size,'.');
  uVar6 = extraout_RDX;
  if (uVar7 != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      uVar1 = *(uint *)(in_RDX + lVar4);
      uVar6 = (ulong)uVar1;
      if (uVar1 < 0x80) {
        if (this->_size <= uVar3) goto LAB_00356f05;
        iVar5 = 1;
      }
      else {
        bVar8 = (byte)uVar1;
        uVar2 = (uint3)(uVar1 >> 8);
        if (uVar1 < 0x800) {
          if ((this->_size <= uVar3 + 1) ||
             (this->_str[uVar3 + 1] = bVar8 & 0x3f | 0x80, this->_size <= uVar3)) goto LAB_00356f05;
          uVar6 = (ulong)CONCAT31(uVar2 >> 6,(char)(uVar1 >> 6)) | 0xc0;
          iVar5 = 2;
        }
        else if (uVar1 < 0x10000) {
          if (this->_size <= uVar3 + 2) {
LAB_00356f05:
            __assert_fail("i < _size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/str.hpp"
                          ,0x52,"CharT &tl::StrT<char>::operator[](u32) [CharT = char]");
          }
          this->_str[uVar3 + 2] = bVar8 & 0x3f | 0x80;
          if ((this->_size <= uVar3 + 1) ||
             (this->_str[uVar3 + 1] = (byte)(uVar1 >> 6) & 0x3f | 0x80, this->_size <= uVar3))
          goto LAB_00356f05;
          uVar6 = (ulong)CONCAT31(uVar2 >> 0xc,(char)(uVar1 >> 0xc)) | 0xe0;
          iVar5 = 3;
        }
        else {
          if (this->_size <= uVar3 + 3) goto LAB_00356f05;
          this->_str[uVar3 + 3] = bVar8 & 0x3f | 0x80;
          if (this->_size <= uVar3 + 2) goto LAB_00356f05;
          this->_str[uVar3 + 2] = (byte)(uVar1 >> 6) & 0x3f | 0x80;
          if ((this->_size <= uVar3 + 1) ||
             (this->_str[uVar3 + 1] = (byte)(uVar1 >> 0xc) & 0x3f | 0x80, this->_size <= uVar3))
          goto LAB_00356f05;
          uVar6 = (ulong)(uVar1 >> 0x12) & 0xffffffffffffff07 | 0xf0;
          iVar5 = 4;
        }
      }
      this->_str[uVar3] = (char)uVar6;
      uVar3 = uVar3 + iVar5;
      lVar4 = lVar4 + 4;
    } while ((ulong)uVar7 << 2 != lVar4);
  }
  SVar9._8_8_ = uVar6;
  SVar9._str = (char *)this;
  return SVar9;
}

Assistant:

Str toUtf8(CStr32 o)
{
    const u32 size = calcSizeUtf8(o);
    Str str(size);
    u32 j = 0;
    for(char32_t c : o) {
        if(c < 0x80) {
            str[j] = c & 0b0111'1111;
            j += 1;
        }
        else if(c < 0x800) {
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1100'0000 | (0b1'1111 & c);
            j += 2;
        }
        else if(c < 0x10000) {
            str[j+2] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1110'0000 | (0b1111 & c);
            j += 3;
        }
        else {
            str[j+3] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+2] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1111'0000 | (0b111 & c);
            j += 4;
        }
    }
    return str;
}